

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t *this_00;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  reference ppFVar7;
  ExtensionSet *this_01;
  size_type sVar8;
  LogMessage *pLVar9;
  iterator iVar10;
  iterator iVar11;
  int __c;
  uint32_t *local_128;
  LogMessage local_f8;
  Voidify local_e2 [2];
  FieldDescriptor **local_e0;
  FieldDescriptor **local_d8;
  byte local_b9;
  LogMessage local_b8;
  Voidify local_a2 [2];
  FieldDescriptor **local_a0;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_98;
  FieldDescriptor **local_90;
  size_type local_88;
  size_t last_size;
  FieldDescriptor **local_78;
  FieldDescriptor **local_70;
  uint *local_68;
  uint32_t *oneof_case_array;
  OneofDescriptor *containing_oneof;
  FieldDescriptor *field;
  undefined1 auStack_48 [4];
  int i;
  anon_class_16_2_4c782404 append_to_output;
  uint32_t last;
  int last_non_weak_field_index;
  uint32_t *has_bits_indices;
  uint32_t *has_bits;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *output_local;
  Message *message_local;
  Reflection *this_local;
  
  has_bits = (uint32_t *)output;
  output_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)message;
  message_local = (Message *)this;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::clear(output);
  bVar3 = internal::ReflectionSchema::IsDefaultInstance(&this->schema_,(Message *)output_local);
  if (!bVar3) {
    bVar3 = internal::ReflectionSchema::HasHasbits(&this->schema_);
    if (bVar3) {
      local_128 = GetHasBits(this,(Message *)output_local);
    }
    else {
      local_128 = (uint32_t *)0x0;
    }
    this_00 = has_bits;
    puVar2 = (this->schema_).has_bit_indices_;
    iVar4 = Descriptor::field_count(this->descriptor_);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)this_00,(long)iVar4);
    append_to_output.output._4_4_ = this->last_non_weak_field_index_;
    append_to_output.output._0_4_ = 0;
    _auStack_48 = &append_to_output.output;
    append_to_output.last = (uint32_t *)&has_bits;
    for (field._4_4_ = 0; field._4_4_ <= append_to_output.output._4_4_;
        field._4_4_ = field._4_4_ + 1) {
      containing_oneof = (OneofDescriptor *)Descriptor::field(this->descriptor_,field._4_4_);
      bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)containing_oneof);
      if (bVar3) {
        iVar4 = FieldSize(this,(Message *)output_local,(FieldDescriptor *)containing_oneof);
        if (0 < iVar4) {
          ListFields::anon_class_16_2_4c782404::operator()
                    ((anon_class_16_2_4c782404 *)auStack_48,(FieldDescriptor *)containing_oneof);
        }
      }
      else {
        oneof_case_array =
             (uint32_t *)FieldDescriptor::containing_oneof((FieldDescriptor *)containing_oneof);
        bVar3 = internal::ReflectionSchema::InRealOneof
                          (&this->schema_,(FieldDescriptor *)containing_oneof);
        if (bVar3) {
          uVar1 = (this->schema_).oneof_case_offset_;
          pcVar6 = (char *)(ulong)uVar1;
          puVar5 = internal::GetConstPointerAtOffset<unsigned_int>(output_local,uVar1);
          local_68 = puVar5;
          pcVar6 = OneofDescriptor::index((OneofDescriptor *)oneof_case_array,pcVar6,__c);
          uVar1 = puVar5[(int)pcVar6];
          iVar4 = FieldDescriptor::number((FieldDescriptor *)containing_oneof);
          if ((ulong)uVar1 == (long)iVar4) {
            ListFields::anon_class_16_2_4c782404::operator()
                      ((anon_class_16_2_4c782404 *)auStack_48,(FieldDescriptor *)containing_oneof);
          }
        }
        else if ((local_128 == (uint32_t *)0x0) || (puVar2[field._4_4_] == 0xffffffff)) {
          bVar3 = HasFieldSingular(this,(Message *)output_local,(FieldDescriptor *)containing_oneof)
          ;
          if (bVar3) {
            ListFields::anon_class_16_2_4c782404::operator()
                      ((anon_class_16_2_4c782404 *)auStack_48,(FieldDescriptor *)containing_oneof);
          }
        }
        else {
          bVar3 = IsFieldPresentGivenHasbits
                            (this,(Message *)output_local,(FieldDescriptor *)containing_oneof,
                             local_128,puVar2[field._4_4_]);
          if (bVar3) {
            ListFields::anon_class_16_2_4c782404::operator()
                      ((anon_class_16_2_4c782404 *)auStack_48,(FieldDescriptor *)containing_oneof);
          }
        }
      }
    }
    if ((int)append_to_output.output == -1) {
      local_70 = (FieldDescriptor **)
                 std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)has_bits);
      local_78 = (FieldDescriptor **)
                 std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)has_bits);
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                (local_70,local_78);
      ppFVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)has_bits);
      append_to_output.output._0_4_ = FieldDescriptor::number(*ppFVar7);
    }
    local_88 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)has_bits);
    bVar3 = internal::ReflectionSchema::HasExtensionSet(&this->schema_);
    if (bVar3) {
      this_01 = GetExtensionSet(this,(Message *)output_local);
      internal::ExtensionSet::AppendToList
                (this_01,this->descriptor_,this->descriptor_pool_,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)has_bits);
      local_98._M_current =
           (FieldDescriptor **)
           std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)has_bits);
      local_90 = (FieldDescriptor **)
                 __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 ::operator+(&local_98,local_88);
      local_a0 = (FieldDescriptor **)
                 std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)has_bits);
      bVar3 = std::
              is_sorted<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                        (local_90,local_a0);
      local_b9 = 0;
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x717,
                   "std::is_sorted(output->begin() + last_size, output->end(), FieldNumberSorter())"
                  );
        local_b9 = 1;
        pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_a2,pLVar9);
      }
      if ((local_b9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      sVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)has_bits);
      if (sVar8 != local_88) {
        ppFVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)has_bits,local_88);
        anon_unknown_6::CheckInOrder(*ppFVar7,(uint32_t *)&append_to_output.output);
      }
    }
    if ((int)append_to_output.output == -1) {
      iVar10 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)has_bits);
      iVar11 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)has_bits);
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                (iVar10._M_current,iVar11._M_current);
    }
    else {
      local_d8 = (FieldDescriptor **)
                 std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)has_bits);
      local_e0 = (FieldDescriptor **)
                 std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)has_bits);
      bVar3 = std::
              is_sorted<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                        (local_d8,local_e0);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x71e,"std::is_sorted(output->begin(), output->end(), FieldNumberSorter())");
        pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f8);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_e2,pLVar9);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_f8);
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  // Fields in messages are usually added with the increasing tags.
  uint32_t last = 0;  // UINT32_MAX if out-of-order
  auto append_to_output = [&last, &output](const FieldDescriptor* field) {
    CheckInOrder(field, &last);
    output->push_back(field);
  };
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        append_to_output(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          append_to_output(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        // Equivalent to: HasFieldSingular(message, field)
        if (IsFieldPresentGivenHasbits(message, field, has_bits,
                                       has_bits_indices[i])) {
          append_to_output(field);
        }
      } else if (HasFieldSingular(message, field)) {
        // Fall back on proto3-style HasBit.
        append_to_output(field);
      }
    }
  }
  // Descriptors of ExtensionSet are appended in their increasing tag
  // order and they are usually bigger than the field tags so if all fields are
  // not sorted, let them be sorted.
  if (last == UINT32_MAX) {
    std::sort(output->begin(), output->end(), FieldNumberSorter());
    last = output->back()->number();
  }
  size_t last_size = output->size();
  if (schema_.HasExtensionSet()) {
    // Descriptors of ExtensionSet are appended in their increasing order.
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
    ABSL_DCHECK(std::is_sorted(output->begin() + last_size, output->end(),
                               FieldNumberSorter()));
    if (output->size() != last_size) {
      CheckInOrder((*output)[last_size], &last);
    }
  }
  if (last != UINT32_MAX) {
    ABSL_DCHECK(
        std::is_sorted(output->begin(), output->end(), FieldNumberSorter()));
  } else {
    // ListFields() must sort output by field number.
    std::sort(output->begin(), output->end(), FieldNumberSorter());
  }
}